

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-junk.c
# Opt level: O3

_Bool borg_remove_stuff(void)

{
  borg_item_conflict *item;
  int32_t iVar1;
  _Bool _Var2;
  wchar_t wVar3;
  int32_t iVar4;
  char *what;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  borg_item_conflict *pbVar8;
  borg_item_conflict *pbVar9;
  uint uVar10;
  long lVar11;
  int32_t local_48;
  
  wVar3 = borg_first_empty_inventory_slot();
  iVar1 = borg.power;
  if (((wVar3 == L'\xffffffff') || (borg.trait[0x6d] != 0)) || (borg.trait[0x6c] != 0)) {
    return false;
  }
  if (2000 < borg_t - borg_began) {
    return false;
  }
  if (0x96 < borg.time_this_panel) {
    return false;
  }
  lVar6 = (long)borg.power;
  uVar7 = (ulong)z_info->pack_size;
  bVar5 = false;
  uVar10 = 0xffffffff;
  local_48 = 0;
  pbVar8 = borg_items;
LAB_0023155b:
  lVar11 = uVar7 * 0x388;
  do {
    pbVar9 = pbVar8;
    if ((pbVar8->curses[lVar11 + -0x26] != false) && (pbVar8->curses[lVar11 + -0x2c] == true)) {
      item = (borg_item_conflict *)(pbVar8->desc + lVar11);
      _Var2 = borg_item_note_needs_id(item);
      pbVar9 = borg_items;
      if (((!_Var2) || (pbVar8->curses[lVar11 + -2] == true)) &&
         (pbVar8->curses[lVar11 + -0x1a] != true)) break;
    }
    uVar7 = uVar7 + 1;
    lVar11 = lVar11 + 0x388;
    pbVar8 = pbVar9;
    if ((ulong)z_info->pack_size + 0xc <= uVar7) {
      if (!bVar5) goto LAB_00231689;
      goto LAB_0023167f;
    }
  } while( true );
  memcpy(borg_items + wVar3,item,0x388);
  memcpy(item,safe_items + wVar3,0x388);
  borg_notice(true);
  iVar4 = borg_power();
  memcpy(item,safe_items->desc + lVar11,0x388);
  pbVar8 = borg_items;
  borg_items[wVar3].iqty = '\0';
  if (iVar1 <= iVar4) {
    local_48 = iVar4;
  }
  if (iVar1 <= iVar4) {
    uVar10 = (uint)uVar7;
  }
  uVar7 = uVar7 + 1;
  bVar5 = true;
  if ((ulong)z_info->pack_size + 0xc <= uVar7) {
LAB_0023167f:
    borg_notice(true);
LAB_00231689:
    if ((int)uVar10 < 0) {
      return false;
    }
    what = format("# Removing %s.  Power with: (%ld) Power w/o (%ld)",borg_items + uVar10,lVar6,
                  (long)local_48);
    borg_note(what);
    borg_keypress(0x74);
    borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                       [(long)(int)uVar10 - (ulong)z_info->pack_size]);
    borg.time_this_panel = borg.time_this_panel + 1;
    return true;
  }
  goto LAB_0023155b;
}

Assistant:

bool borg_remove_stuff(void)
{
    int hole = borg_first_empty_inventory_slot();

    int32_t p, b_p = 0L, w_p = 0L;

    int i, b_i = -1;

    borg_item *item;

    bool fix = false;

    /* if there was no hole, done */
    if (hole == -1)
        return false;

    /*  hack to prevent the swap till you drop loop */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK])
        return false;

    /* Forbid if been sitting on level forever */
    /*    Just come back and work through the loop later */
    if (borg_t - borg_began > 2000)
        return false;
    if (borg.time_this_panel > 150)
        return false;

    /* Start with good power */
    b_p = borg.power;

    /* Scan equip */
    for (i = INVEN_WIELD; i < INVEN_TOTAL; i++) {
        item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require aware */
        if (!item->aware)
            continue;

        /* Require "known" (or needs id) unless we know it is cursed */
        if (borg_item_note_needs_id(item) && !item->cursed)
            continue;

        /* skip it if it has not been decursed */
        if (item->one_ring)
            continue;

        /* Take off the item */
        memcpy(&borg_items[hole], item, sizeof(borg_item));

        /* Erase the item from equip */
        /* note, copy the "hole" onto the item so it doesn't have attributes */
        memcpy(item, &safe_items[hole], sizeof(borg_item));

        /* Fix later */
        fix = true;

        /* Examine the inventory */
        borg_notice(true);

        /* Evaluate the inventory */
        p = borg_power();

        /* Restore the item */
        memcpy(item, &safe_items[i], sizeof(borg_item));

        /* Restore the hole */
        borg_items[hole].iqty = 0;

        /* Track the crappy items */
        /* crappy includes things that do not add to power */

        if (p >= b_p) {
            b_i = i;
            w_p = p;
        }
    }

    /* Restore bonuses */
    if (fix)
        borg_notice(true);

    /* No item */
    if (b_i >= 0) {
        /* Get the item */
        item = &borg_items[b_i];

        /* Log */
        borg_note(format("# Removing %s.  Power with: (%ld) Power w/o (%ld)",
            item->desc, (long int)b_p, (long int)w_p));

        /* Wear it */
        borg_keypress('t');
        borg_keypress(all_letters_nohjkl[b_i - INVEN_WIELD]);

        /* Did something */
        borg.time_this_panel++;
        return true;
    }

    /* Nope */
    return false;
}